

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys_test.cpp
# Opt level: O1

void __thiscall jbcoin::tests::ValidatorKeys_test::testRevoke(ValidatorKeys_test *this)

{
  suite *psVar1;
  int iVar2;
  char *pcVar3;
  SF_Blob *sigField;
  long lVar4;
  optional<unsigned_int> seq;
  value_type keyType;
  optional<jbcoin::Slice> pk;
  string manifest;
  string revocation;
  ValidatorKeys keys;
  SerialIter sit;
  STObject st;
  bool local_141;
  type local_140;
  KeyType local_134;
  optional<jbcoin::Slice> local_130;
  string local_118;
  undefined1 local_f8 [32];
  undefined1 local_d8 [8];
  size_t local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8 [2];
  SecretKey local_a0;
  SerialIter local_78;
  STObject local_60;
  
  local_d8 = (undefined1  [8])local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"Revoke","");
  psVar1 = (this->super_suite).testcase.suite_;
  psVar1->abort_ = false;
  beast::unit_test::runner::testcase<void>(psVar1->runner_,(string *)local_d8);
  if (local_d8 != (undefined1  [8])local_c8) {
    operator_delete((void *)local_d8,local_c8[0]._M_allocated_capacity + 1);
  }
  lVar4 = 0x328;
  do {
    local_134 = *(KeyType *)((long)&(this->super_suite)._vptr_suite + lVar4);
    ValidatorKeys::ValidatorKeys((ValidatorKeys *)local_d8,&local_134);
    ValidatorKeys::revoke_abi_cxx11_((ValidatorKeys *)local_f8,(char *)local_d8);
    STObject::STObject(&local_60,(SField *)sfGeneric);
    beast::detail::base64_decode<void>(&local_118,(string *)local_f8);
    SerialIter::SerialIter(&local_78,local_118._M_dataplus._M_p,local_118._M_string_length);
    STObject::set(&local_60,&local_78,0);
    local_140 = (type)get<unsigned_int,jbcoin::STInteger<unsigned_int>>
                                (&local_60,
                                 (TypedField<jbcoin::STInteger<unsigned_int>_> *)sfSequence);
    beast::unit_test::suite::expect<boost::optional<unsigned_int>,char[1]>
              (&this->super_suite,(optional<unsigned_int> *)&local_140,(char (*) [1])0x280297,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0xfa);
    if (local_140.m_initialized == false) {
      pcVar3 = "reference_const_type boost::optional<unsigned int>::get() const [T = unsigned int]";
LAB_0019e235:
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bb,pcVar3
                   );
    }
    local_130.super_type.m_initialized = local_140.m_storage == 0xffffffff;
    pcVar3 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
    ;
    beast::unit_test::suite::expect<bool,char[1]>
              (&this->super_suite,(bool *)&local_130,(char (*) [1])0x280297,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0xfb);
    get<jbcoin::Slice,jbcoin::STBlob>
              (&local_130,(jbcoin *)&local_60,(STObject *)sfPublicKey,
               (TypedField<jbcoin::STBlob> *)pcVar3);
    beast::unit_test::suite::expect<boost::optional<jbcoin::Slice>,char[1]>
              (&this->super_suite,&local_130,(char (*) [1])0x280297,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0xfe);
    if (local_130.super_type.m_initialized == false) {
      pcVar3 = 
      "reference_const_type boost::optional<jbcoin::Slice>::get() const [T = jbcoin::Slice]";
      goto LAB_0019e235;
    }
    if (local_130.super_type.m_storage.dummy_._8_8_ == local_d0) {
      if (local_130.super_type.m_storage.dummy_._8_8_ == 0) {
        local_141 = true;
      }
      else {
        iVar2 = bcmp((void *)local_130.super_type.m_storage.dummy_.aligner_,local_c8,
                     local_130.super_type.m_storage.dummy_._8_8_);
        local_141 = iVar2 == 0;
      }
    }
    else {
      local_141 = false;
    }
    sigField = (SF_Blob *)0xff;
    beast::unit_test::suite::expect<bool,char[1]>
              (&this->super_suite,&local_141,(char (*) [1])0x280297,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0xff);
    iVar2 = verify((jbcoin *)&local_60,(STObject *)&HashPrefix::manifest,(HashPrefix *)&local_d0,
                   (PublicKey *)sfMasterSignature,sigField);
    local_141 = SUB41(iVar2,0);
    beast::unit_test::suite::expect<bool,char[1]>
              (&this->super_suite,&local_141,(char (*) [1])0x280297,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x102);
    if (local_130.super_type.m_initialized == true) {
      local_130.super_type.m_initialized = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    STObject::~STObject(&local_60);
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
    }
    SecretKey::~SecretKey(&local_a0);
    lVar4 = lVar4 + 4;
    if (lVar4 == 0x330) {
      return;
    }
  } while( true );
}

Assistant:

void
    testRevoke ()
    {
        testcase ("Revoke");

        for (auto const keyType : keyTypes)
        {
            ValidatorKeys keys (keyType);

            auto const revocation = keys.revoke ();

            STObject st (sfGeneric);
            auto const manifest = beast::detail::base64_decode(revocation);
            SerialIter sit (manifest.data (), manifest.size ());
            st.set (sit);

            auto const seq = get (st, sfSequence);
            BEAST_EXPECT (seq);
            BEAST_EXPECT (*seq == std::numeric_limits<std::uint32_t>::max ());

            auto const pk = get (st, sfPublicKey);
            BEAST_EXPECT (pk);
            BEAST_EXPECT (*pk == keys.publicKey ());
            BEAST_EXPECT (verify (
                st, HashPrefix::manifest, keys.publicKey (),
                sfMasterSignature));
        }
    }